

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O1

void __thiscall
nuraft::peer::send_req(peer *this,ptr<peer> *myself,ptr<req_msg> *req,rpc_handler *handler)

{
  uint uVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  int iVar6;
  msg_type type;
  rpc_handler h;
  ptr<rpc_client> rpc_local;
  ptr<rpc_result> pending;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  peer *local_68;
  shared_ptr<nuraft::rpc_client> local_58;
  shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>
  local_48;
  element_type *local_38;
  
  if (((this->abandoned_)._M_base._M_i & 1U) == 0) {
    if ((((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) &&
        (peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar3 != (element_type *)0x0)) &&
       (iVar6 = (**(code **)(*(long *)peVar3 + 0x38))(), 5 < iVar6)) {
      local_38 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar4 = (req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar1 = (peVar4->super_msg_base).src_;
      uVar2 = (peVar4->super_msg_base).dst_;
      msg_type_to_string_abi_cxx11_
                ((string *)local_d8,(nuraft *)(ulong)(peVar4->super_msg_base).type_,type);
      msg_if_given_abi_cxx11_
                ((string *)local_b8,"send req %d -> %d, type %s",(ulong)uVar1,(ulong)uVar2,
                 local_d8._0_8_);
      (**(code **)(*(long *)local_38 + 0x40))
                (local_38,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"send_req",0x2c,local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_);
      }
      if ((undefined1 *)local_d8._0_8_ != local_c8) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    local_48.
    super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>,std::allocator<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&>
              (&local_48.
                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               (cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>
                **)&local_48,
               (allocator<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>
                *)local_b8,handler);
    local_58.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->rpc_protector_);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    peVar5 = (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar5 == (element_type *)0x0) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) &&
         (iVar6 = (**(code **)(*(long *)peVar3 + 0x38))(), 5 < iVar6)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_b8,"rpc local is null");
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                   ,"send_req",0x35,local_b8);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_);
        }
      }
      LOCK();
      (this->busy_flag_)._M_base._M_i = false;
      UNLOCK();
    }
    else {
      local_58.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_58.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->rpc_protector_);
    if (peVar5 != (element_type *)0x0) {
      local_b8._0_8_ = handle_rpc_result;
      local_b8._8_8_ = 0;
      std::
      _Tuple_impl<1ul,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>,std::_Placeholder<1>,std::_Placeholder<2>>
      ::
      _Tuple_impl<std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,void>
                ((_Tuple_impl<1ul,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>,std::_Placeholder<1>,std::_Placeholder<2>>
                  *)(local_b8 + 0x10),myself,&local_58,req,&local_48,
                 (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2
                );
      local_d8._0_8_ = (pointer)0x0;
      local_d8._8_8_ = 0;
      local_c8._0_8_ = 0;
      local_c8._8_8_ = 0;
      local_68 = this;
      local_d8._0_8_ = operator_new(0x58);
      *(undefined8 *)local_d8._0_8_ = local_b8._0_8_;
      *(undefined8 *)(local_d8._0_8_ + 8) = local_b8._8_8_;
      *(char *)(local_d8._0_8_ + 0x18) = '\0';
      *(char *)(local_d8._0_8_ + 0x19) = '\0';
      *(char *)(local_d8._0_8_ + 0x1a) = '\0';
      *(char *)(local_d8._0_8_ + 0x1b) = '\0';
      *(char *)(local_d8._0_8_ + 0x1c) = '\0';
      *(char *)(local_d8._0_8_ + 0x1d) = '\0';
      *(char *)(local_d8._0_8_ + 0x1e) = '\0';
      *(char *)(local_d8._0_8_ + 0x1f) = '\0';
      *(size_type *)(local_d8._0_8_ + 0x10) = local_a8._M_allocated_capacity;
      *(undefined8 *)(local_d8._0_8_ + 0x18) = local_a8._8_8_;
      *(char *)(local_d8._0_8_ + 0x28) = '\0';
      *(char *)(local_d8._0_8_ + 0x29) = '\0';
      *(char *)(local_d8._0_8_ + 0x2a) = '\0';
      *(char *)(local_d8._0_8_ + 0x2b) = '\0';
      *(char *)(local_d8._0_8_ + 0x2c) = '\0';
      *(char *)(local_d8._0_8_ + 0x2d) = '\0';
      *(char *)(local_d8._0_8_ + 0x2e) = '\0';
      *(char *)(local_d8._0_8_ + 0x2f) = '\0';
      *(undefined8 *)(local_d8._0_8_ + 0x20) = local_98;
      *(undefined8 *)(local_d8._0_8_ + 0x28) = uStack_90;
      *(char *)(local_d8._0_8_ + 0x38) = '\0';
      *(char *)(local_d8._0_8_ + 0x39) = '\0';
      *(char *)(local_d8._0_8_ + 0x3a) = '\0';
      *(char *)(local_d8._0_8_ + 0x3b) = '\0';
      *(char *)(local_d8._0_8_ + 0x3c) = '\0';
      *(char *)(local_d8._0_8_ + 0x3d) = '\0';
      *(char *)(local_d8._0_8_ + 0x3e) = '\0';
      *(char *)(local_d8._0_8_ + 0x3f) = '\0';
      *(undefined8 *)(local_d8._0_8_ + 0x30) = local_88;
      *(undefined8 *)(local_d8._0_8_ + 0x38) = uStack_80;
      *(char *)(local_d8._0_8_ + 0x48) = '\0';
      *(char *)(local_d8._0_8_ + 0x49) = '\0';
      *(char *)(local_d8._0_8_ + 0x4a) = '\0';
      *(char *)(local_d8._0_8_ + 0x4b) = '\0';
      *(char *)(local_d8._0_8_ + 0x4c) = '\0';
      *(char *)(local_d8._0_8_ + 0x4d) = '\0';
      *(char *)(local_d8._0_8_ + 0x4e) = '\0';
      *(char *)(local_d8._0_8_ + 0x4f) = '\0';
      *(undefined8 *)(local_d8._0_8_ + 0x40) = local_78;
      *(undefined8 *)(local_d8._0_8_ + 0x48) = uStack_70;
      *(peer **)(local_d8._0_8_ + 0x50) = local_68;
      uStack_70 = 0;
      local_78 = 0;
      uStack_80 = 0;
      local_88 = 0;
      uStack_90 = 0;
      local_98 = 0;
      local_a8._8_8_ = 0;
      local_a8._M_allocated_capacity = 0;
      local_c8._8_8_ =
           std::
           _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::peer::*(nuraft::peer_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
           ::_M_invoke;
      local_c8._0_8_ =
           std::
           _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::peer::*(nuraft::peer_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
           ::_M_manager;
      if (local_58.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (**(code **)(*(long *)local_58.
                              super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 0x10))
                  (local_58.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,req,local_d8,0);
      }
      if ((code *)local_c8._0_8_ != (code *)0x0) {
        (*(code *)local_c8._0_8_)(local_d8,local_d8,3);
      }
    }
    if (local_58.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_48.
        super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  else {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) &&
       (iVar6 = (**(code **)(*(long *)peVar3 + 0x38))(), 1 < iVar6)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_b8,"peer %d has been shut down, cannot send request",
                 (ulong)(uint)((this->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (**(code **)(*(long *)peVar3 + 0x40))
                (peVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"send_req",0x24,(string *)local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_);
      }
    }
  }
  return;
}

Assistant:

void peer::send_req( ptr<peer> myself,
                     ptr<req_msg>& req,
                     rpc_handler& handler )
{
    if (abandoned_) {
        p_er("peer %d has been shut down, cannot send request",
             config_->get_id());
        return;
    }

    if (req) {
        p_tr("send req %d -> %d, type %s",
             req->get_src(),
             req->get_dst(),
             msg_type_to_string( req->get_type() ).c_str() );
    }

    ptr<rpc_result> pending = cs_new<rpc_result>(handler);
    ptr<rpc_client> rpc_local = nullptr;
    {   std::lock_guard<std::mutex> l(rpc_protector_);
        if (!rpc_) {
            // Nothing will be sent, immediately free it
            // to serve next operation.
            p_tr("rpc local is null");
            set_free();
            return;
        }
        rpc_local = rpc_;
    }
    rpc_handler h = (rpc_handler)std::bind
                    ( &peer::handle_rpc_result,
                      this,
                      myself,
                      rpc_local,
                      req,
                      pending,
                      std::placeholders::_1,
                      std::placeholders::_2 );
    if (rpc_local) {
        rpc_local->send(req, h);
    }
}